

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  bool header;
  int extraout_EDX;
  sigaction sa;
  string local_108;
  string local_e8;
  sigaction local_c8;
  
  progname = *argv;
  bVar1 = true;
  do {
    header = bVar1;
    iVar2 = getopt(argc,argv,"vhn");
    bVar1 = false;
  } while (iVar2 == 0x6e);
  if (iVar2 == -1) {
    memset(&local_c8,0,0x98);
    sigemptyset(&local_c8.sa_mask);
    local_c8.__sigaction_handler.sa_handler = segfault_sigaction;
    local_c8.sa_flags = 4;
    sigaction(0xb,&local_c8,(sigaction *)0x0);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
    initstreams(&local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    quantiletobin::doit(header);
    return 0;
  }
  if (iVar2 == 0x76) {
    main_cold_1();
  }
  main_cold_3();
  if (extraout_EDX == 1) {
    main_cold_2();
  }
  _Unwind_Resume();
}

Assistant:

int main(int argc, char* argv[]) {

  progname = argv[0];
  int opt;
  bool header = true;

  while ((opt = getopt(argc, argv, "vhn")) != -1) {
    switch (opt) {
      case 'v':
	      fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
	      exit(EXIT_FAILURE);
	      break;
      case 'n':
	      header = false;
	      break;
      case 'h':
      default:
	      help();
	      exit(EXIT_FAILURE);
	      break;
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {

    initstreams();
    quantiletobin::doit(header);
    return EXIT_SUCCESS;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "%s: Memory allocation failed\n", progname);
    exit(EXIT_FAILURE);

  }

}